

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  FieldDescriptor *field;
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  TypeInfo *pTVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  CppType CVar8;
  DynamicMessage *pDVar9;
  ulong uVar10;
  long lVar11;
  int i;
  long lVar12;
  long lVar13;
  RepeatedField<int> *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_003e1770;
  pDVar2 = this->type_info_->type;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  lVar11 = (long)this->type_info_->extensions_offset;
  if (lVar11 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar11));
  }
  lVar12 = 0;
  lVar11 = 0;
  do {
    lVar13 = (long)*(int *)(pDVar2 + 0x68);
    if (lVar13 <= lVar11) {
      return;
    }
    lVar3 = *(long *)(pDVar2 + 0x28);
    field = (FieldDescriptor *)(lVar3 + lVar12);
    bVar7 = anon_unknown_0::InRealOneof(field);
    pTVar4 = this->type_info_;
    if (bVar7) {
      lVar5 = *(long *)(lVar3 + 0x58 + lVar12);
      iVar6 = (int)((lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x30)) / 0x30);
      if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(iVar6 * 4 + pTVar4->oneof_case_offset)) == *(int *)(lVar3 + 0x44 + lVar12))
      {
        uVar1 = (pTVar4->offsets)._M_t.
                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar13 + iVar6];
        CVar8 = FieldDescriptor::cpp_type(field);
        this_00 = (RepeatedField<int> *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)uVar1);
        if (CVar8 == CPPTYPE_STRING) {
          pDVar9 = this->type_info_->prototype;
          uVar10 = (ulong)(this->type_info_->offsets)._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar11];
LAB_002e50cc:
          internal::ArenaStringPtr::Destroy
                    ((ArenaStringPtr *)this_00,
                     *(string **)
                      ((long)&(pDVar9->super_Message).super_MessageLite._vptr_MessageLite + uVar10),
                     (Arena *)0x0);
        }
        else {
          CVar8 = FieldDescriptor::cpp_type(field);
          if (CVar8 == CPPTYPE_MESSAGE) {
LAB_002e5121:
            if (*(long **)this_00 != (long *)0x0) {
              (**(code **)(**(long **)this_00 + 8))();
            }
          }
        }
      }
    }
    else {
      this_00 = (RepeatedField<int> *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)(int)(pTVar4->offsets)._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar11]);
      if (*(int *)(lVar3 + 0x3c + lVar12) == 3) {
        CVar8 = FieldDescriptor::cpp_type(field);
        switch(CVar8) {
        case CPPTYPE_INT32:
        case CPPTYPE_ENUM:
          RepeatedField<int>::~RepeatedField(this_00);
          break;
        case CPPTYPE_INT64:
          RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
          break;
        case CPPTYPE_UINT32:
          RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
          break;
        case CPPTYPE_UINT64:
          RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
          break;
        case CPPTYPE_DOUBLE:
          RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
          break;
        case CPPTYPE_FLOAT:
          RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
          break;
        case CPPTYPE_BOOL:
          RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
          break;
        case CPPTYPE_STRING:
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)this_00);
          break;
        case CPPTYPE_MESSAGE:
          bVar7 = FieldDescriptor::is_map(field);
          if (bVar7) {
            (*(code *)**(undefined8 **)this_00)(this_00);
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_00);
          }
        }
      }
      else {
        CVar8 = FieldDescriptor::cpp_type(field);
        if (CVar8 == CPPTYPE_STRING) {
          pDVar9 = this->type_info_->prototype;
          uVar10 = (ulong)(int)(this->type_info_->offsets)._M_t.
                               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar11];
          goto LAB_002e50cc;
        }
        CVar8 = FieldDescriptor::cpp_type(field);
        if ((CVar8 == CPPTYPE_MESSAGE) &&
           (pDVar9 = this->type_info_->prototype, pDVar9 != (DynamicMessage *)0x0 && pDVar9 != this)
           ) goto LAB_002e5121;
      }
    }
    lVar11 = lVar11 + 1;
    lVar12 = lVar12 + 0x98;
  } while( true );
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
        OffsetToPointer(type_info_->extensions_offset))
        ->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr =
          OffsetToPointer(type_info_->oneof_case_offset +
                          sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) == field->number()) {
        field_ptr = OffsetToPointer(
            type_info_->offsets[descriptor->field_count() +
                                field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(default_value,
                                                                NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}